

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

unsigned_long cmsys::Directory::GetNumberOfFilesInDirectory(string *name,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  allocator<char> local_91;
  string local_90 [32];
  dirent *local_70;
  dirent *d;
  unsigned_long count;
  allocator<char> local_49;
  string local_48 [32];
  DIR *local_28;
  DIR *dir;
  string *errorMessage_local;
  string *name_local;
  
  dir = (DIR *)errorMessage;
  errorMessage_local = name;
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_28 = opendir(pcVar2);
  if (local_28 == (DIR *)0x0) {
    if (dir != (DIR *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar2,&local_49);
      std::__cxx11::string::operator=((string *)dir,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    name_local = (string *)0x0;
  }
  else {
    d = (dirent *)0x0;
    local_70 = readdir(local_28);
    while (local_70 != (dirent *)0x0) {
      d = (dirent *)((long)&d->d_ino + 1);
      local_70 = readdir(local_28);
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      closedir(local_28);
      name_local = (string *)d;
    }
    else {
      if (dir != (DIR *)0x0) {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_90,pcVar2,&local_91);
        std::__cxx11::string::operator=((string *)dir,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      name_local = (string *)0x0;
    }
  }
  return (unsigned_long)name_local;
}

Assistant:

unsigned long Directory::GetNumberOfFilesInDirectory(const std::string& name,
                                                     std::string* errorMessage)
{
  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return 0;
  }

  unsigned long count = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    count++;
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return false;
  }

  closedir(dir);
  return count;
}